

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float ImGui::CalcItemWidth(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  float *pfVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  pIVar3 = GImGui->CurrentWindow;
  pfVar4 = &(GImGui->NextItemData).Width;
  if (((GImGui->NextItemData).Flags & 1) == 0) {
    pfVar4 = &(pIVar3->DC).ItemWidth;
  }
  fVar1 = *pfVar4;
  auVar5 = ZEXT416((uint)fVar1);
  if (fVar1 < 0.0) {
    fVar2 = (pIVar3->ContentRegionRect).Max.x;
    if (((pIVar3->DC).CurrentColumns != (ImGuiOldColumns *)0x0) ||
       (GImGui->CurrentTable != (ImGuiTable *)0x0)) {
      fVar2 = (pIVar3->WorkRect).Max.x;
    }
    auVar5 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),
                        ZEXT416((uint)(fVar1 + (fVar2 - (pIVar3->DC).CursorPos.x))));
  }
  auVar6._0_4_ = (int)auVar5._0_4_;
  auVar6._4_4_ = (int)auVar5._4_4_;
  auVar6._8_4_ = (int)auVar5._8_4_;
  auVar6._12_4_ = (int)auVar5._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  return auVar5._0_4_;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float w;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        w = g.NextItemData.Width;
    else
        w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        float region_max_x = GetContentRegionMaxAbs().x;
        w = ImMax(1.0f, region_max_x - window->DC.CursorPos.x + w);
    }
    w = IM_FLOOR(w);
    return w;
}